

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_8.c
# Opt level: O2

parasail_result_t *
parasail_nw_rowcol_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  longlong *plVar1;
  __m256i alVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  longlong lVar22;
  longlong lVar23;
  char cVar24;
  int8_t iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  parasail_result_t *ppVar29;
  __m256i *palVar30;
  __m256i *ptr;
  __m256i *ptr_00;
  int8_t *ptr_01;
  long lVar31;
  char cVar32;
  char *pcVar33;
  int iVar34;
  int iVar35;
  char *__format;
  long lVar36;
  ulong uVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  ulong size;
  int32_t segNum;
  uint uVar41;
  long lVar42;
  __m256i *palVar43;
  undefined1 uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  __m256i_8_t e;
  __m256i_8_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar46 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar33 = "profile";
  }
  else {
    pvVar4 = (profile->profile8).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar33 = "profile->profile8.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar33 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar33 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar33 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar33 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar33 = "open";
        }
        else {
          if (-1 < gap) {
            uVar26 = uVar3 - 1;
            size = (ulong)uVar3 + 0x1f >> 5;
            uVar7 = (ulong)uVar26 % size;
            iVar27 = ppVar5->min;
            iVar35 = -open;
            uVar41 = (uint)(byte)-(char)iVar27;
            if (iVar27 != iVar35 && SBORROW4(iVar27,iVar35) == iVar27 + open < 0) {
              uVar41 = open;
            }
            cVar24 = '~' - (char)ppVar5->max;
            ppVar29 = parasail_result_new_rowcol1((uint)((ulong)uVar3 + 0x1f) & 0x7fffffe0,s2Len);
            if (ppVar29 != (parasail_result_t *)0x0) {
              ppVar29->flag = ppVar29->flag | 0x20140801;
              palVar30 = parasail_memalign___m256i(0x20,size);
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
              if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                  (ptr != (__m256i *)0x0 && palVar30 != (__m256i *)0x0)) {
                iVar27 = s2Len + -1;
                iVar34 = 0x1f - (int)(uVar26 / size);
                uVar44 = (undefined1)open;
                auVar50[1] = uVar44;
                auVar50[0] = uVar44;
                auVar50[2] = uVar44;
                auVar50[3] = uVar44;
                auVar50[4] = uVar44;
                auVar50[5] = uVar44;
                auVar50[6] = uVar44;
                auVar50[7] = uVar44;
                auVar50[8] = uVar44;
                auVar50[9] = uVar44;
                auVar50[10] = uVar44;
                auVar50[0xb] = uVar44;
                auVar50[0xc] = uVar44;
                auVar50[0xd] = uVar44;
                auVar50[0xe] = uVar44;
                auVar50[0xf] = uVar44;
                auVar50[0x10] = uVar44;
                auVar50[0x11] = uVar44;
                auVar50[0x12] = uVar44;
                auVar50[0x13] = uVar44;
                auVar50[0x14] = uVar44;
                auVar50[0x15] = uVar44;
                auVar50[0x16] = uVar44;
                auVar50[0x17] = uVar44;
                auVar50[0x18] = uVar44;
                auVar50[0x19] = uVar44;
                auVar50[0x1a] = uVar44;
                auVar50[0x1b] = uVar44;
                auVar50[0x1c] = uVar44;
                auVar50[0x1d] = uVar44;
                auVar50[0x1e] = uVar44;
                auVar50[0x1f] = uVar44;
                uVar44 = (undefined1)gap;
                auVar51[1] = uVar44;
                auVar51[0] = uVar44;
                auVar51[2] = uVar44;
                auVar51[3] = uVar44;
                auVar51[4] = uVar44;
                auVar51[5] = uVar44;
                auVar51[6] = uVar44;
                auVar51[7] = uVar44;
                auVar51[8] = uVar44;
                auVar51[9] = uVar44;
                auVar51[10] = uVar44;
                auVar51[0xb] = uVar44;
                auVar51[0xc] = uVar44;
                auVar51[0xd] = uVar44;
                auVar51[0xe] = uVar44;
                auVar51[0xf] = uVar44;
                auVar51[0x10] = uVar44;
                auVar51[0x11] = uVar44;
                auVar51[0x12] = uVar44;
                auVar51[0x13] = uVar44;
                auVar51[0x14] = uVar44;
                auVar51[0x15] = uVar44;
                auVar51[0x16] = uVar44;
                auVar51[0x17] = uVar44;
                auVar51[0x18] = uVar44;
                auVar51[0x19] = uVar44;
                auVar51[0x1a] = uVar44;
                auVar51[0x1b] = uVar44;
                auVar51[0x1c] = uVar44;
                auVar51[0x1d] = uVar44;
                auVar51[0x1e] = uVar44;
                auVar51[0x1f] = uVar44;
                cVar32 = (char)uVar41 + -0x7f;
                auVar45[1] = cVar32;
                auVar45[0] = cVar32;
                auVar45[2] = cVar32;
                auVar45[3] = cVar32;
                auVar45[4] = cVar32;
                auVar45[5] = cVar32;
                auVar45[6] = cVar32;
                auVar45[7] = cVar32;
                auVar45[8] = cVar32;
                auVar45[9] = cVar32;
                auVar45[10] = cVar32;
                auVar45[0xb] = cVar32;
                auVar45[0xc] = cVar32;
                auVar45[0xd] = cVar32;
                auVar45[0xe] = cVar32;
                auVar45[0xf] = cVar32;
                auVar46[0x10] = cVar32;
                auVar46._0_16_ = auVar45;
                auVar46[0x11] = cVar32;
                auVar46[0x12] = cVar32;
                auVar46[0x13] = cVar32;
                auVar46[0x14] = cVar32;
                auVar46[0x15] = cVar32;
                auVar46[0x16] = cVar32;
                auVar46[0x17] = cVar32;
                auVar46[0x18] = cVar32;
                auVar46[0x19] = cVar32;
                auVar46[0x1a] = cVar32;
                auVar46[0x1b] = cVar32;
                auVar46[0x1c] = cVar32;
                auVar46[0x1d] = cVar32;
                auVar46[0x1e] = cVar32;
                auVar46[0x1f] = cVar32;
                auVar47[1] = cVar24;
                auVar47[0] = cVar24;
                auVar47[2] = cVar24;
                auVar47[3] = cVar24;
                auVar47[4] = cVar24;
                auVar47[5] = cVar24;
                auVar47[6] = cVar24;
                auVar47[7] = cVar24;
                auVar47[8] = cVar24;
                auVar47[9] = cVar24;
                auVar47[10] = cVar24;
                auVar47[0xb] = cVar24;
                auVar47[0xc] = cVar24;
                auVar47[0xd] = cVar24;
                auVar47[0xe] = cVar24;
                auVar47[0xf] = cVar24;
                auVar47[0x10] = cVar24;
                auVar47[0x11] = cVar24;
                auVar47[0x12] = cVar24;
                auVar47[0x13] = cVar24;
                auVar47[0x14] = cVar24;
                auVar47[0x15] = cVar24;
                auVar47[0x16] = cVar24;
                auVar47[0x17] = cVar24;
                auVar47[0x18] = cVar24;
                auVar47[0x19] = cVar24;
                auVar47[0x1a] = cVar24;
                auVar47[0x1b] = cVar24;
                auVar47[0x1c] = cVar24;
                auVar47[0x1d] = cVar24;
                auVar47[0x1e] = cVar24;
                auVar47[0x1f] = cVar24;
                lVar36 = (long)iVar35;
                for (uVar37 = 0; uVar37 != size; uVar37 = uVar37 + 1) {
                  lVar40 = lVar36;
                  for (lVar42 = 0; lVar42 != 0x20; lVar42 = lVar42 + 1) {
                    lVar38 = -0x80;
                    if (-0x80 < lVar40) {
                      lVar38 = lVar40;
                    }
                    lVar31 = lVar40 - (ulong)(uint)open;
                    if ((long)(lVar40 - (ulong)(uint)open) < -0x7f) {
                      lVar31 = -0x80;
                    }
                    *(char *)((long)&local_80 + lVar42) = (char)lVar38;
                    *(char *)((long)&local_a0 + lVar42) = (char)lVar31;
                    lVar40 = lVar40 - size * (uint)gap;
                  }
                  palVar43 = palVar30 + uVar37;
                  (*palVar43)[0] = local_80;
                  (*palVar43)[1] = lStack_78;
                  (*palVar43)[2] = lStack_70;
                  (*palVar43)[3] = lStack_68;
                  palVar43 = ptr_00 + uVar37;
                  (*palVar43)[0] = local_a0;
                  (*palVar43)[1] = lStack_98;
                  (*palVar43)[2] = lStack_90;
                  (*palVar43)[3] = lStack_88;
                  lVar36 = lVar36 - (ulong)(uint)gap;
                }
                *ptr_01 = '\0';
                for (uVar37 = 1; s2Len + 1 != uVar37; uVar37 = uVar37 + 1) {
                  iVar25 = -0x80;
                  if (-0x80 < iVar35) {
                    iVar25 = (int8_t)iVar35;
                  }
                  ptr_01[uVar37] = iVar25;
                  iVar35 = iVar35 - gap;
                }
                iVar35 = (int)size;
                lVar36 = size * 0x20;
                uVar37 = 0;
                auVar49 = ZEXT3264(auVar47);
                auVar48 = ZEXT3264(auVar46);
                do {
                  palVar43 = palVar30;
                  if (uVar37 == (uint)s2Len) {
                    for (uVar37 = 0; (uint)(iVar35 * 4) != uVar37; uVar37 = uVar37 + 4) {
                      piVar6 = ((ppVar29->field_4).rowcols)->score_col;
                      plVar1 = *palVar43 + uVar37;
                      lVar22 = *plVar1;
                      cVar24 = *(char *)((long)plVar1 + 1);
                      cVar32 = *(char *)((long)plVar1 + 2);
                      cVar10 = *(char *)((long)plVar1 + 3);
                      cVar11 = *(char *)((long)plVar1 + 4);
                      cVar12 = *(char *)((long)plVar1 + 5);
                      cVar13 = *(char *)((long)plVar1 + 6);
                      cVar14 = *(char *)((long)plVar1 + 7);
                      plVar1 = *palVar43 + uVar37 + 2;
                      lVar23 = *plVar1;
                      cVar15 = *(char *)((long)plVar1 + 1);
                      cVar16 = *(char *)((long)plVar1 + 2);
                      cVar17 = *(char *)((long)plVar1 + 3);
                      cVar18 = *(char *)((long)plVar1 + 4);
                      cVar19 = *(char *)((long)plVar1 + 5);
                      cVar20 = *(char *)((long)plVar1 + 6);
                      cVar21 = *(char *)((long)plVar1 + 7);
                      *(int *)((long)piVar6 + uVar37) = (int)(char)lVar22;
                      *(int *)((long)piVar6 + (uint)(iVar35 * 4) + uVar37) = (int)cVar24;
                      *(int *)((long)piVar6 + (uint)(iVar35 * 8) + uVar37) = (int)cVar32;
                      *(int *)((long)piVar6 + size * 0xc + uVar37) = (int)cVar10;
                      *(int *)((long)piVar6 + (uint)(iVar35 << 4) + uVar37) = (int)cVar11;
                      *(int *)((long)piVar6 + size * 0x14 + uVar37) = (int)cVar12;
                      *(int *)((long)piVar6 + size * 0x18 + uVar37) = (int)cVar13;
                      *(int *)((long)piVar6 + size * 0x1c + uVar37) = (int)cVar14;
                      *(int *)((long)piVar6 + lVar36 + uVar37) = (int)(char)lVar22;
                      *(int *)((long)piVar6 + size * 0x24 + uVar37) = (int)cVar24;
                      *(int *)((long)piVar6 + size * 0x28 + uVar37) = (int)cVar32;
                      *(int *)((long)piVar6 + size * 0x2c + uVar37) = (int)cVar10;
                      *(int *)((long)piVar6 + size * 0x30 + uVar37) = (int)cVar11;
                      *(int *)((long)piVar6 + size * 0x34 + uVar37) = (int)cVar12;
                      *(int *)((long)piVar6 + size * 0x38 + uVar37) = (int)cVar13;
                      *(int *)((long)piVar6 + size * 0x3c + uVar37) = (int)cVar14;
                      *(int *)((long)piVar6 + size * 0x40 + uVar37) = (int)(char)lVar23;
                      *(int *)((long)piVar6 + size * 0x44 + uVar37) = (int)cVar15;
                      *(int *)((long)piVar6 + size * 0x48 + uVar37) = (int)cVar16;
                      *(int *)((long)piVar6 + size * 0x4c + uVar37) = (int)cVar17;
                      *(int *)((long)piVar6 + size * 0x50 + uVar37) = (int)cVar18;
                      *(int *)((long)piVar6 + size * 0x54 + uVar37) = (int)cVar19;
                      *(int *)((long)piVar6 + size * 0x58 + uVar37) = (int)cVar20;
                      *(int *)((long)piVar6 + size * 0x5c + uVar37) = (int)cVar21;
                      *(int *)((long)piVar6 + size * 0x60 + uVar37) = (int)(char)lVar23;
                      *(int *)((long)piVar6 + size * 100 + uVar37) = (int)cVar15;
                      *(int *)((long)piVar6 + size * 0x68 + uVar37) = (int)cVar16;
                      *(int *)((long)piVar6 + size * 0x6c + uVar37) = (int)cVar17;
                      *(int *)((long)piVar6 + size * 0x70 + uVar37) = (int)cVar18;
                      *(int *)((long)piVar6 + size * 0x74 + uVar37) = (int)cVar19;
                      *(int *)((long)piVar6 + size * 0x78 + uVar37) = (int)cVar20;
                      *(int *)((long)piVar6 + size * 0x7c + uVar37) = (int)cVar21;
                    }
                    alVar2 = palVar43[uVar7];
                    for (iVar35 = 0; iVar35 < iVar34; iVar35 = iVar35 + 1) {
                      auVar50 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,
                                                0x28);
                      alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar50,0xf);
                    }
                    auVar46 = vpcmpgtb_avx2(auVar46,auVar49._0_32_);
                    auVar47 = vpcmpgtb_avx2(auVar48._0_32_,auVar47);
                    auVar46 = vpor_avx2(auVar47,auVar46);
                    if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar46 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar46 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar46 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar46 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar46 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar46 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar46 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar46 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar46 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar46 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar46 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar46 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar46 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar46 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar46 >> 0x7f,0) == '\0')
                                      && (auVar46 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar46 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar46 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar46 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar46 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar46 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar46 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar46 >> 0xbf,0) == '\0') &&
                              (auVar46 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar46 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar46 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar46 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar46 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar46 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar46 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar46[0x1f]) {
                      cVar24 = alVar2[2]._7_1_;
                    }
                    else {
                      *(byte *)&ppVar29->flag = (byte)ppVar29->flag | 0x40;
                      cVar24 = '\0';
                      iVar27 = 0;
                      uVar26 = 0;
                    }
                    ppVar29->score = (int)cVar24;
                    ppVar29->end_query = uVar26;
                    ppVar29->end_ref = iVar27;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(palVar43);
                    return ppVar29;
                  }
                  auVar52 = SUB3216(palVar43[iVar35 - 1],0);
                  auVar53._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar45;
                  auVar53._16_16_ = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar52;
                  auVar53 = vpalignr_avx2((undefined1  [32])palVar43[iVar35 - 1],auVar53,0xf);
                  iVar39 = ppVar5->mapper[(byte)s2[uVar37]];
                  auVar52 = vpinsrb_avx(auVar53._0_16_,(uint)(byte)ptr_01[uVar37],0);
                  auVar53 = vpblendd_avx2(auVar53,ZEXT1632(auVar52),0xf);
                  auVar9 = auVar46;
                  for (lVar40 = 0; lVar36 != lVar40; lVar40 = lVar40 + 0x20) {
                    auVar54 = vpaddsb_avx2(auVar53,*(undefined1 (*) [32])
                                                    ((long)pvVar4 +
                                                    lVar40 + (long)(iVar39 * iVar35) * 0x20));
                    auVar53 = *(undefined1 (*) [32])((long)*ptr_00 + lVar40);
                    auVar8 = vpmaxsb_avx2(auVar53,auVar9);
                    auVar54 = vpmaxsb_avx2(auVar54,auVar8);
                    *(undefined1 (*) [32])((long)*ptr + lVar40) = auVar54;
                    auVar8 = vpmaxsb_avx2(auVar48._0_32_,auVar54);
                    auVar48 = ZEXT3264(auVar8);
                    auVar8 = vpminsb_avx2(auVar49._0_32_,auVar53);
                    auVar8 = vpminsb_avx2(auVar8,auVar9);
                    auVar8 = vpminsb_avx2(auVar8,auVar54);
                    auVar49 = ZEXT3264(auVar8);
                    auVar54 = vpsubsb_avx2(auVar54,auVar50);
                    auVar53 = vpsubsb_avx2(auVar53,auVar51);
                    auVar53 = vpmaxsb_avx2(auVar53,auVar54);
                    *(undefined1 (*) [32])((long)*ptr_00 + lVar40) = auVar53;
                    auVar53 = vpsubsb_avx2(auVar9,auVar51);
                    auVar9 = vpmaxsb_avx2(auVar53,auVar54);
                    auVar53 = *(undefined1 (*) [32])((long)*palVar43 + lVar40);
                  }
                  for (iVar39 = 0; iVar39 != 0x20; iVar39 = iVar39 + 1) {
                    iVar28 = ptr_01[uVar37 + 1] - open;
                    if (iVar28 < -0x7f) {
                      iVar28 = -0x80;
                    }
                    auVar54._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar45;
                    auVar54._16_16_ = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar9._0_16_;
                    auVar53 = vpalignr_avx2(auVar9,auVar54,0xf);
                    auVar52 = vpinsrb_avx(auVar53._0_16_,iVar28,0);
                    auVar9 = vpblendd_avx2(auVar53,ZEXT1632(auVar52),0xf);
                    lVar40 = 0;
                    while (lVar36 + 0x20 != lVar40 + 0x20) {
                      auVar53 = vpmaxsb_avx2(auVar9,*(undefined1 (*) [32])((long)*ptr + lVar40));
                      *(undefined1 (*) [32])((long)*ptr + lVar40) = auVar53;
                      auVar54 = vpminsb_avx2(auVar49._0_32_,auVar53);
                      auVar49 = ZEXT3264(auVar54);
                      auVar54 = vpmaxsb_avx2(auVar48._0_32_,auVar53);
                      auVar48 = ZEXT3264(auVar54);
                      auVar53 = vpsubsb_avx2(auVar53,auVar50);
                      auVar9 = vpsubsb_avx2(auVar9,auVar51);
                      auVar53 = vpcmpgtb_avx2(auVar9,auVar53);
                      lVar40 = lVar40 + 0x20;
                      if ((((((((((((((((((((((((((((((((auVar53 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar53 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar53 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar53 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar53 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar53 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar53 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar53 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar53 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar53 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar53 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar53 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar53 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar53 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar53 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar53 >> 0x7f,0) == '\0') &&
                                        (auVar53 >> 0x87 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar53 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar53 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar53 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar53 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar53 >> 0xaf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar53 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar53 >> 0xbf,0) == '\0') &&
                                (auVar53 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar53 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar53 >> 0xd7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar53 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar53 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar53 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar53 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar53[0x1f]) goto LAB_007c17b3;
                    }
                  }
LAB_007c17b3:
                  alVar2 = ptr[uVar7];
                  for (iVar39 = 0; iVar39 < iVar34; iVar39 = iVar39 + 1) {
                    auVar53 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28
                                             );
                    alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar53,0xf);
                  }
                  ((ppVar29->field_4).rowcols)->score_row[uVar37] = (int)alVar2[2]._7_1_;
                  uVar37 = uVar37 + 1;
                  palVar30 = ptr;
                  ptr = palVar43;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar33 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_rowcol_striped_profile_avx2_256_8",pcVar33);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}